

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetMarkerDetectorStateML
                   (XrMarkerDetectorML markerDetector,XrMarkerDetectorStateML *state)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  XrResult XVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  XrMarkerDetectorML_T *in_stack_fffffffffffffd98;
  string local_260;
  XrMarkerDetectorML markerDetector_local;
  string local_238;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3b9ce510;
  markerDetector_local = markerDetector;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrMarkerDetectorML_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&markerDetector_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrMarkerDetectorMLHandle(&markerDetector_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrMarkerDetectorML_T_*>::getWithInstanceInfo
                      (&g_markerdetectorml_info,markerDetector_local);
    instance_info = pVar4.second;
    if (state == (XrMarkerDetectorStateML *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetMarkerDetectorStateML-state-parameter",
                 (allocator *)&local_1f8);
      std::__cxx11::string::string
                ((string *)&local_260,"xrGetMarkerDetectorStateML",
                 (allocator *)&stack0xfffffffffffffd9f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_238,
                 "Invalid NULL for XrMarkerDetectorStateML \"state\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd9e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c0,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      this = &local_1c0;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrGetMarkerDetectorStateML",(allocator *)&local_260);
      XVar3 = XR_SUCCESS;
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,state);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 == XR_SUCCESS) goto LAB_001eb62c;
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetMarkerDetectorStateML-state-parameter",
                 (allocator *)&local_1f8);
      std::__cxx11::string::string
                ((string *)&local_260,"xrGetMarkerDetectorStateML",
                 (allocator *)&stack0xfffffffffffffd9f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_238,"Command xrGetMarkerDetectorStateML param state is invalid",
                 (allocator *)&stack0xfffffffffffffd9e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d8,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      this = &local_1d8;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&oss);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrMarkerDetectorML handle \"markerDetector\" ");
    HandleToHexString<XrMarkerDetectorML_T*>(in_stack_fffffffffffffd98);
    std::operator<<((ostream *)&oss,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::string
              ((string *)&local_260,"VUID-xrGetMarkerDetectorStateML-markerDetector-parameter",
               (allocator *)&stack0xfffffffffffffd9f);
    std::__cxx11::string::string
              ((string *)&local_238,"xrGetMarkerDetectorStateML",
               (allocator *)&stack0xfffffffffffffd9e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1a8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_260,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_238,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1a8,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1a8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar3 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001eb62c:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar3;
}

Assistant:

XrResult GenValidUsageInputsXrGetMarkerDetectorStateML(
XrMarkerDetectorML markerDetector,
XrMarkerDetectorStateML* state) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(markerDetector, XR_OBJECT_TYPE_MARKER_DETECTOR_ML);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrMarkerDetectorMLHandle(&markerDetector);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrMarkerDetectorML handle \"markerDetector\" ";
                oss << HandleToHexString(markerDetector);
                CoreValidLogMessage(nullptr, "VUID-xrGetMarkerDetectorStateML-markerDetector-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetMarkerDetectorStateML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_markerdetectorml_info.getWithInstanceInfo(markerDetector);
        GenValidUsageXrHandleInfo *gen_markerdetectorml_info = info_with_instance.first;
        (void)gen_markerdetectorml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == state) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetMarkerDetectorStateML-state-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetMarkerDetectorStateML", objects_info,
                                "Invalid NULL for XrMarkerDetectorStateML \"state\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrMarkerDetectorStateML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetMarkerDetectorStateML", objects_info,
                                                        false, true, state);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetMarkerDetectorStateML-state-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetMarkerDetectorStateML",
                                objects_info,
                                "Command xrGetMarkerDetectorStateML param state is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}